

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::eval_reflect_vec2(ShaderEvalContext *c)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  float fVar6;
  float fVar7;
  float res;
  float fVar8;
  float fVar9;
  float fVar10;
  
  fVar1 = c->in[0].m_data[1];
  fVar2 = c->in[0].m_data[3];
  uVar3 = *(undefined8 *)c->in[1].m_data;
  fVar6 = (float)uVar3;
  fVar7 = (float)((ulong)uVar3 >> 0x20);
  fVar8 = 0.0;
  fVar9 = fVar7;
  fVar10 = fVar2;
  bVar4 = true;
  do {
    bVar5 = bVar4;
    fVar8 = fVar8 + fVar9 * fVar10;
    fVar9 = fVar6;
    fVar10 = fVar1;
    bVar4 = false;
  } while (bVar5);
  *(ulong *)((c->color).m_data + 1) =
       CONCAT44(fVar1 - fVar6 * (fVar8 + fVar8),fVar2 - fVar7 * (fVar8 + fVar8));
  return;
}

Assistant:

Vector<T, 2>			swizzle		(int a, int b) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); return Vector<T, 2>(m_data[a], m_data[b]); }